

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

void __thiscall asl::Log::storeState(Log *this)

{
  bool bVar1;
  bool bVar2;
  anon_union_16_2_78e7fdac_for_String_2 *b;
  String value;
  String local_48;
  String local_30;
  
  local_48.field_2._space[0] = '\0';
  local_48._size = 0;
  local_48._len = 0;
  bVar1 = this->_useconsole;
  bVar2 = this->_usefile;
  String::operator+=(&local_48,(char)this->_maxLevel + '0');
  String::operator+=(&local_48,bVar2 | bVar1 * '\x02' | 0x30);
  if ((this->_logfile)._size == 0) {
    b = &(this->_logfile).field_2;
  }
  else {
    b = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_logfile).field_2._str;
  }
  String::append(&local_48,b->_space,(this->_logfile)._len);
  String::String(&local_30,"ASL_LOG");
  Process::setEnv(&local_30,&local_48);
  if (local_30._size != 0) {
    free(local_30.field_2._str);
  }
  if (local_48._size != 0) {
    free((void *)CONCAT71(local_48.field_2._1_7_,local_48.field_2._space[0]));
  }
  return;
}

Assistant:

void Log::storeState()
{
#ifndef __ANDROID_API__
	String value;
	int flags = (_usefile ? 1 : 0) | (_useconsole ? 2 : 0);
	value << char(_maxLevel + '0') << char(flags + '0') << _logfile;
	Process::setEnv("ASL_LOG", value);
#endif
}